

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_stl_vec_x86_64(TCGContext *tcg_ctx,TCGv_vec r,TCGv_ptr b,TCGArg o,TCGType low_type)

{
  vec_gen_3_x86_64(tcg_ctx,INDEX_op_st_vec,low_type,0,(TCGArg)(r + (long)tcg_ctx),
                   (TCGArg)(b + (long)tcg_ctx),o);
  return;
}

Assistant:

void tcg_gen_stl_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_ptr b, TCGArg o, TCGType low_type)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg bi = tcgv_ptr_arg(tcg_ctx, b);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    tcg_debug_assert(low_type >= TCG_TYPE_V64);
    tcg_debug_assert(low_type <= type);
    vec_gen_3(tcg_ctx, INDEX_op_st_vec, low_type, 0, ri, bi, o);
}